

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

cppcms_capi_cookie * cppcms_capi_session_cookie_next(cppcms_capi_session *session)

{
  bool bVar1;
  _Self *__x;
  cppcms_capi_cookie *pcVar2;
  long in_RDI;
  cppcms_capi_cookie *r;
  cookie *in_stack_00000258;
  cppcms_capi_cookie *in_stack_00000260;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  *in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffd0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
  local_28 [3];
  long local_10;
  cppcms_capi_cookie *local_8;
  
  if (in_RDI == 0) {
    local_8 = (cppcms_capi_cookie *)0x0;
  }
  else {
    local_10 = in_RDI;
    cppcms_capi_session::check_saved((cppcms_capi_session *)in_stack_ffffffffffffffd0._M_node);
    __x = (_Self *)(local_10 + 0x110);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
    ::end(in_stack_ffffffffffffffb8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
    ::_Rb_tree_const_iterator(local_28,(iterator *)&stack0xffffffffffffffd0);
    bVar1 = std::operator==(__x,local_28);
    if (bVar1) {
      local_8 = (cppcms_capi_cookie *)0x0;
    }
    else {
      pcVar2 = (cppcms_capi_cookie *)operator_new(0x148);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
                    *)0x47bd4c);
      cppcms_capi_cookie::cppcms_capi_cookie(in_stack_00000260,in_stack_00000258);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
      ::operator++(__x);
      local_8 = pcVar2;
    }
  }
  return local_8;
}

Assistant:

cppcms_capi_cookie *cppcms_capi_session_cookie_next(cppcms_capi_session *session)
{
	TRY {
		if(!session)
			return 0;
		session->check_saved();
		if(session->adapter.cookies_ptr == session->adapter.cookies.end())
			return 0;
		cppcms_capi_cookie *r=new cppcms_capi_cookie(session->adapter.cookies_ptr->second);
		++session->adapter.cookies_ptr;
		return r;
	}